

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,RepeatLoopStatement *stmt)

{
  bool bVar1;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState> *in_RDI;
  type oldBreakStates;
  DataFlowState currState;
  ConstantValue cv;
  SmallVector<slang::analysis::DataFlowState,_2UL> *in_stack_fffffffffffffc58;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_fffffffffffffc60;
  Expression *in_stack_fffffffffffffc70;
  DataFlowState *in_stack_fffffffffffffce0;
  DataFlowAnalysis *in_stack_fffffffffffffce8;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_fffffffffffffd20;
  SmallVector<slang::analysis::DataFlowState,_2UL> *in_stack_fffffffffffffd40;
  DataFlowState *in_stack_fffffffffffffd48;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_fffffffffffffd50;
  
  visitCondition(in_RDI,in_stack_fffffffffffffc70);
  unsplit(in_stack_fffffffffffffd20);
  DataFlowAnalysis::copyState(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  SmallVector<slang::analysis::DataFlowState,_2UL>::SmallVector
            ((SmallVector<slang::analysis::DataFlowState,_2UL> *)in_stack_fffffffffffffc60,
             in_stack_fffffffffffffc58);
  SmallVectorBase<slang::analysis::DataFlowState>::clear
            ((SmallVectorBase<slang::analysis::DataFlowState> *)in_stack_fffffffffffffc60);
  visit<slang::ast::Statement>(in_stack_fffffffffffffc60,(Statement *)in_stack_fffffffffffffc58);
  bVar1 = slang::ConstantValue::isTrue((ConstantValue *)in_stack_fffffffffffffc60);
  if (bVar1) {
    DataFlowState::DataFlowState
              ((DataFlowState *)&stack0xfffffffffffffd20,(DataFlowState *)in_stack_fffffffffffffc58)
    ;
    loopTail(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    DataFlowState::~DataFlowState((DataFlowState *)0x824d9b);
  }
  else {
    DataFlowState::DataFlowState
              ((DataFlowState *)in_stack_fffffffffffffc60,(DataFlowState *)&stack0xfffffffffffffc80)
    ;
    loopTail(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    DataFlowState::~DataFlowState((DataFlowState *)0x824e30);
  }
  SmallVector<slang::analysis::DataFlowState,_2UL>::~SmallVector
            ((SmallVector<slang::analysis::DataFlowState,_2UL> *)0x824e5f);
  DataFlowState::~DataFlowState((DataFlowState *)0x824e6c);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x824e79);
  return;
}

Assistant:

void visitStmt(const RepeatLoopStatement& stmt) {
        auto cv = visitCondition(stmt.count);
        unsplit();

        auto currState = (DERIVED).copyState(state);
        auto oldBreakStates = std::move(breakStates);
        breakStates.clear();
        visit(stmt.body);

        // If the repeat count is known to be positive we know the
        // body will execute at least once so we can keep our current
        // state; otherwise we need to join with the pre-loop state.
        if (cv.isTrue())
            loopTail(std::move(state), std::move(oldBreakStates));
        else
            loopTail(std::move(currState), std::move(oldBreakStates));
    }